

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O3

void dill_free_handle(dill_exec_handle handle)

{
  int iVar1;
  
  iVar1 = handle->ref_count;
  handle->ref_count = iVar1 + -1;
  if (1 < iVar1) {
    return;
  }
  if (((long)handle->size != 0) && (handle->code_base != (void *)0x0)) {
    iVar1 = munmap(handle->code_base,(long)handle->size);
    if (iVar1 == -1) {
      perror("unmap 1");
    }
  }
  free(handle);
  return;
}

Assistant:

extern void
dill_free_handle(dill_exec_handle handle)
{
    handle->ref_count--;
    if (handle->ref_count > 0)
        return;
    if (handle->size != 0) {
        if (handle->code_base) {
#ifdef USE_MMAP_CODE_SEG
            if (munmap(handle->code_base, handle->size) == -1)
                perror("unmap 1");
#else
            free(handle->code_base);
#endif
        }
    }
    handle->code_base = NULL;
    handle->size = 0;
#ifdef BUILD_EMULATOR
    free_emulator_handler_bits(handle);
#endif
    free(handle);
}